

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> * __thiscall
CLI::App::get_subcommands(App *this,function<bool_(const_CLI::App_*)> *filter)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  iterator __first;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  __last;
  iterator __pred;
  iterator this_00;
  long in_RSI;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *in_RDI;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *subcomms;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *in_stack_fffffffffffffef8;
  __normal_iterator<const_CLI::App_*const_*,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  *in_stack_ffffffffffffff00;
  allocator_type *in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *in_stack_ffffffffffffff20;
  
  std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::size
            ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
             (in_RSI + 0x2c0));
  std::allocator<const_CLI::App_*>::allocator((allocator<const_CLI::App_*> *)0x1257c4);
  std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::allocator<const_CLI::App_*>::~allocator((allocator<const_CLI::App_*> *)0x1257e7);
  cVar2 = ::std::
          begin<std::vector<std::shared_ptr<CLI::App>,std::allocator<std::shared_ptr<CLI::App>>>>
                    ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                      *)in_stack_fffffffffffffef8);
  cVar3 = ::std::
          end<std::vector<std::shared_ptr<CLI::App>,std::allocator<std::shared_ptr<CLI::App>>>>
                    ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                      *)in_stack_fffffffffffffef8);
  __first = ::std::begin<std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>
                      (in_stack_fffffffffffffef8);
  __last = ::std::
           transform<__gnu_cxx::__normal_iterator<std::shared_ptr<CLI::App>const*,std::vector<std::shared_ptr<CLI::App>,std::allocator<std::shared_ptr<CLI::App>>>>,__gnu_cxx::__normal_iterator<CLI::App_const**,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>,CLI::App::get_subcommands(std::function<bool(CLI::App_const*)>const&)const::_lambda(std::shared_ptr<CLI::App>const&)_1_>
                     (cVar2._M_current,cVar3._M_current,__first._M_current);
  bVar1 = ::std::function::operator_cast_to_bool((function<bool_(const_CLI::App_*)> *)0x12588d);
  if (bVar1) {
    __pred = ::std::begin<std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>
                       (in_stack_fffffffffffffef8);
    ::std::end<std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>
              (in_stack_fffffffffffffef8);
    ::std::
    remove_if<__gnu_cxx::__normal_iterator<CLI::App_const**,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>,CLI::App::get_subcommands(std::function<bool(CLI::App_const*)>const&)const::_lambda(CLI::App_const*)_1_>
              ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                )__first._M_current,__last,(anon_class_8_1_552cbcb6_for__M_pred)__pred._M_current);
    __gnu_cxx::
    __normal_iterator<CLI::App_const*const*,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>
    ::__normal_iterator<CLI::App_const**>
              (in_stack_ffffffffffffff00,
               (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                *)in_stack_fffffffffffffef8);
    this_00 = ::std::end<std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>
                        (in_stack_fffffffffffffef8);
    __gnu_cxx::
    __normal_iterator<CLI::App_const*const*,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>
    ::__normal_iterator<CLI::App_const**>
              ((__normal_iterator<const_CLI::App_*const_*,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                *)this_00._M_current,
               (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                *)in_stack_fffffffffffffef8);
    std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::erase
              ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)__pred._M_current,
               (const_iterator)__first._M_current,(const_iterator)__last._M_current);
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::vector<const App *> App::get_subcommands(const std::function<bool(const App *)> &filter) const {
    std::vector<const App *> subcomms(subcommands_.size());
    std::transform(
        std::begin(subcommands_), std::end(subcommands_), std::begin(subcomms), [](const App_p &v) { return v.get(); });

    if(filter) {
        subcomms.erase(std::remove_if(std::begin(subcomms),
                                      std::end(subcomms),
                                      [&filter](const App *app) { return !filter(app); }),
                       std::end(subcomms));
    }

    return subcomms;
}